

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

bool __thiscall base_uint<256U>::EqualTo(base_uint<256U> *this,uint64_t b)

{
  uint uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  uVar1 = 7;
  do {
    if (uVar1 < 2) {
      if ((uint32_t)(b >> 0x20) == this->pn[1]) {
        bVar3 = this->pn[0] == (uint32_t)b;
        goto LAB_001527cf;
      }
      break;
    }
    uVar2 = (ulong)uVar1;
    uVar1 = uVar1 - 1;
  } while (this->pn[uVar2] == 0);
  bVar3 = false;
LAB_001527cf:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool base_uint<BITS>::EqualTo(uint64_t b) const
{
    for (int i = WIDTH - 1; i >= 2; i--) {
        if (pn[i])
            return false;
    }
    if (pn[1] != (b >> 32))
        return false;
    if (pn[0] != (b & 0xfffffffful))
        return false;
    return true;
}